

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tourmng.cpp
# Opt level: O0

bool __thiscall
banksia::TourMng::pairingMatchList
          (TourMng *this,
          vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *playerVec,int round)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  string *psVar6;
  ulong uVar7;
  ostream *poVar8;
  undefined4 in_EDX;
  vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *in_RSI;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  string str;
  MatchRecord *m;
  iterator __end1;
  iterator __begin1;
  vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_> *__range1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pairedSet;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str_2;
  MatchRecord record;
  iterator it;
  value_type luckPlayer;
  int i_1;
  size_type k;
  int i;
  int luckyIdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str_1;
  undefined4 in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaec;
  TourPlayer *in_stack_fffffffffffffaf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  TourPlayer *in_stack_fffffffffffffaf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  MatchRecord *in_stack_fffffffffffffb00;
  undefined1 uVar11;
  const_iterator in_stack_fffffffffffffb08;
  undefined7 in_stack_fffffffffffffb10;
  undefined1 in_stack_fffffffffffffb17;
  MatchRecord *in_stack_fffffffffffffb18;
  undefined6 in_stack_fffffffffffffb20;
  undefined1 in_stack_fffffffffffffb26;
  undefined1 in_stack_fffffffffffffb27;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffb28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb30;
  allocator *in_stack_fffffffffffffb38;
  undefined8 in_stack_fffffffffffffb48;
  string *in_stack_fffffffffffffb50;
  string *in_stack_fffffffffffffb58;
  MatchRecord *in_stack_fffffffffffffb60;
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [39];
  allocator<char> local_379;
  string local_378 [24];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffca0;
  string local_358 [4];
  int in_stack_fffffffffffffcac;
  vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *in_stack_fffffffffffffcb0;
  TourMng *in_stack_fffffffffffffcb8;
  string local_338 [32];
  string local_318 [36];
  undefined4 local_2f4;
  _Base_ptr local_2f0;
  undefined1 local_2e8;
  string local_2e0 [32];
  string local_2c0 [32];
  reference local_2a0;
  MatchRecord *local_298;
  __normal_iterator<banksia::MatchRecord_*,_std::vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>_>
  local_290;
  long local_288;
  undefined1 local_280 [64];
  TourPlayer *local_240;
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [40];
  undefined4 local_188;
  undefined4 local_108;
  undefined4 local_dc;
  int local_d8;
  TourPlayer *local_d0;
  TourPlayer *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [2];
  int local_64;
  ulong local_60;
  int local_54;
  int local_50;
  string local_40 [36];
  undefined4 local_1c;
  byte local_1;
  
  local_1c = in_EDX;
  sVar4 = std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::size(in_RSI);
  if (sVar4 < 2) {
    sVar4 = std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::size(in_RSI);
    uVar11 = (undefined1)((ulong)in_stack_fffffffffffffb00 >> 0x38);
    if (sVar4 == 1) {
      std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::front
                ((vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *)
                 in_stack_fffffffffffffaf0);
      std::operator+((char *)in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
      matchLog((TourMng *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
               (string *)in_stack_fffffffffffffb08._M_current,(bool)uVar11);
      std::__cxx11::string::~string(local_40);
    }
    local_1 = 0;
    goto LAB_0019b5bd;
  }
  sVar4 = std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::size(in_RSI);
  if ((sVar4 & 1) != 0) {
    local_50 = -1;
    for (local_54 = 0; local_54 < 10; local_54 = local_54 + 1) {
      iVar3 = rand();
      in_stack_fffffffffffffb58 = (string *)(long)iVar3;
      sVar4 = std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::size(in_RSI);
      local_60 = (ulong)in_stack_fffffffffffffb58 % sVar4;
      pvVar5 = std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::at
                         ((vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *)
                          in_stack_fffffffffffffaf0,
                          CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
      if (pvVar5->byeCnt == 0) {
        local_50 = (int)local_60;
        break;
      }
    }
    uVar11 = (undefined1)((ulong)in_stack_fffffffffffffb48 >> 0x38);
    if (local_50 < 0) {
      local_64 = 0;
      while( true ) {
        in_stack_fffffffffffffb50 = (string *)(long)local_64;
        psVar6 = (string *)
                 std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::size
                           (in_RSI);
        uVar11 = (undefined1)((ulong)in_stack_fffffffffffffb48 >> 0x38);
        if (psVar6 <= in_stack_fffffffffffffb50) break;
        pvVar5 = std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::at
                           ((vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *)
                            in_stack_fffffffffffffaf0,
                            CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
        uVar11 = (undefined1)((ulong)in_stack_fffffffffffffb48 >> 0x38);
        if (pvVar5->byeCnt == 0) {
          local_50 = local_64;
          break;
        }
        local_64 = local_64 + 1;
      }
    }
    if (local_50 < 0) {
      iVar3 = rand();
      uVar7 = (ulong)iVar3;
      sVar4 = std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::size(in_RSI);
      local_50 = (int)(uVar7 % sVar4);
      poVar8 = std::operator<<((ostream *)&std::cerr,
                               "Warning: all players have been bye (odd players who got free wins)."
                              );
      uVar11 = (undefined1)(uVar7 >> 0x38);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::at
              ((vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *)
               in_stack_fffffffffffffaf0,
               CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    TourPlayer::TourPlayer((TourPlayer *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    local_c0 = (TourPlayer *)
               std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::begin
                         ((vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *)
                          CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    std::
    advance<__gnu_cxx::__normal_iterator<banksia::TourPlayer*,std::vector<banksia::TourPlayer,std::allocator<banksia::TourPlayer>>>,int>
              ((__normal_iterator<banksia::TourPlayer_*,_std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>_>
                *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
               (int)((ulong)in_stack_fffffffffffffb08._M_current >> 0x20));
    __gnu_cxx::
    __normal_iterator<banksia::TourPlayer_const*,std::vector<banksia::TourPlayer,std::allocator<banksia::TourPlayer>>>
    ::__normal_iterator<banksia::TourPlayer*>
              ((__normal_iterator<const_banksia::TourPlayer_*,_std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>_>
                *)in_stack_fffffffffffffaf0,
               (__normal_iterator<banksia::TourPlayer_*,_std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>_>
                *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    local_d0 = (TourPlayer *)
               std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::erase
                         ((vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *)
                          in_stack_fffffffffffffb00,in_stack_fffffffffffffb08);
    pbVar10 = local_b0;
    in_stack_fffffffffffffb38 = &local_1b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b0,"",in_stack_fffffffffffffb38);
    MatchRecord::MatchRecord
              (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
               (bool)uVar11);
    std::__cxx11::string::~string(local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    local_dc = local_1c;
    local_188 = 2;
    local_108 = 1;
    local_d8 = rand();
    addMatchRecord_simple
              ((TourMng *)
               CONCAT17(in_stack_fffffffffffffb27,
                        CONCAT16(in_stack_fffffffffffffb26,in_stack_fffffffffffffb20)),
               in_stack_fffffffffffffb18);
    std::operator+((char *)in_stack_fffffffffffffb38,pbVar10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffaf8,(char *)in_stack_fffffffffffffaf0);
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb28._M_node,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffb27,
                            CONCAT16(in_stack_fffffffffffffb26,in_stack_fffffffffffffb20)));
    std::__cxx11::string::~string(local_238);
    std::__cxx11::string::~string(local_1f8);
    std::__cxx11::string::~string(local_218);
    matchLog((TourMng *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
             (string *)in_stack_fffffffffffffb08._M_current,
             SUB81((ulong)in_stack_fffffffffffffb00 >> 0x38,0));
    std::__cxx11::string::~string(local_1d8);
    MatchRecord::~MatchRecord(in_stack_fffffffffffffb00);
    TourPlayer::~TourPlayer(in_stack_fffffffffffffaf0);
  }
  local_240 = (TourPlayer *)
              std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::begin
                        ((vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *)
                         CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  local_280._56_8_ =
       std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::end
                 ((vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *)
                  CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  std::
  sort<__gnu_cxx::__normal_iterator<banksia::TourPlayer*,std::vector<banksia::TourPlayer,std::allocator<banksia::TourPlayer>>>,banksia::TourMng::pairingMatchList(std::vector<banksia::TourPlayer,std::allocator<banksia::TourPlayer>>,int)::__0>
            (local_240,local_280._56_8_);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x19ae67);
  local_288 = in_RDI + 0x200;
  local_290._M_current =
       (MatchRecord *)
       std::vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>::begin
                 ((vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_> *)
                  CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  local_298 = (MatchRecord *)
              std::vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>::end
                        ((vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_> *)
                         CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<banksia::MatchRecord_*,_std::vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>_>
                        *)in_stack_fffffffffffffaf0,
                       (__normal_iterator<banksia::MatchRecord_*,_std::vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>_>
                        *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    uVar11 = (undefined1)((ulong)in_stack_fffffffffffffb00 >> 0x38);
    iVar3 = (int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
    if (!bVar1) break;
    local_2a0 = __gnu_cxx::
                __normal_iterator<banksia::MatchRecord_*,_std::vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>_>
                ::operator*(&local_290);
    uVar7 = std::__cxx11::string::empty();
    if (((uVar7 & 1) == 0) && (uVar7 = std::__cxx11::string::empty(), (uVar7 & 1) == 0)) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffb18,
                     (char *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffaf8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffaf0);
      pVar9 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                       (value_type *)in_stack_fffffffffffffb08._M_current);
      in_stack_fffffffffffffb28 = pVar9.first._M_node;
      in_stack_fffffffffffffb27 = pVar9.second;
      local_2f0 = in_stack_fffffffffffffb28._M_node;
      local_2e8 = in_stack_fffffffffffffb27;
      std::__cxx11::string::~string(local_2c0);
      std::__cxx11::string::~string(local_2e0);
    }
    __gnu_cxx::
    __normal_iterator<banksia::MatchRecord_*,_std::vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>_>
    ::operator++(&local_290);
  }
  uVar2 = pairingMatchListRecusive
                    (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,
                     in_stack_fffffffffffffca0);
  if ((bool)uVar2) {
LAB_0019b109:
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            tourTypeNames[*(int *)(in_RDI + 0x1a8)];
    pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_379;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_378,(char *)__rhs,(allocator *)pbVar10);
    std::operator+((char *)pbVar10,__rhs);
    std::operator+(pbVar10,(char *)__rhs);
    std::__cxx11::to_string(iVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb28._M_node,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffb27,CONCAT16(uVar2,in_stack_fffffffffffffb20)));
    std::__cxx11::string::~string(local_3a0);
    std::__cxx11::string::~string(local_338);
    std::__cxx11::string::~string(local_358);
    std::__cxx11::string::~string(local_378);
    std::allocator<char>::~allocator(&local_379);
    if (*(int *)(in_RDI + 0x1a8) == 2) {
      std::__cxx11::to_string(iVar3);
      std::operator+((char *)pbVar10,__rhs);
      std::__cxx11::string::operator+=(local_318,local_3c0);
      std::__cxx11::string::~string(local_3c0);
      std::__cxx11::string::~string(local_3e0);
    }
    std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::size(in_RSI);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffb28._M_node);
    std::operator+((char *)pbVar10,__rhs);
    std::operator+(pbVar10,(char *)__rhs);
    uncompletedMatches((TourMng *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10));
    std::__cxx11::to_string(iVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb28._M_node,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffb27,CONCAT16(uVar2,in_stack_fffffffffffffb20)));
    std::__cxx11::string::operator+=(local_318,local_400);
    std::__cxx11::string::~string(local_400);
    std::__cxx11::string::~string(local_480);
    std::__cxx11::string::~string(local_420);
    std::__cxx11::string::~string(local_440);
    std::__cxx11::string::~string(local_460);
    matchLog((TourMng *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
             (string *)in_stack_fffffffffffffb08._M_current,(bool)uVar11);
    local_1 = 1;
    local_2f4 = 1;
    std::__cxx11::string::~string(local_318);
  }
  else {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "Warning: All players have played together already.");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    in_stack_fffffffffffffb08._M_current = (TourPlayer *)local_280;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x19b091);
    in_stack_fffffffffffffb17 =
         pairingMatchListRecusive
                   (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,
                    in_stack_fffffffffffffca0);
    if ((bool)in_stack_fffffffffffffb17) goto LAB_0019b109;
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error: cannot pair players.");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    local_1 = 0;
    local_2f4 = 1;
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x19b5ac);
LAB_0019b5bd:
  return (bool)(local_1 & 1);
}

Assistant:

bool TourMng::pairingMatchList(std::vector<TourPlayer> playerVec, int round)
{
    if (playerVec.size() < 2) {
        if (playerVec.size() == 1) {
            auto str = "\n* The winner is " + playerVec.front().name;
            matchLog(str, true);
        }
        return false;
    }
    
    // odd/bye players, one won't have opponent and he is lucky to set win
    if (playerVec.size() & 1) {
        auto luckyIdx = -1;
        for (int i = 0; i < 10; i++) {
            auto k = std::rand() % playerVec.size();
            if (playerVec.at(k).byeCnt == 0) {
                luckyIdx = int(k);
                break;
            }
        }
        
        if (luckyIdx < 0) {
            for (int i = 0; i <  playerVec.size(); i++) {
                if (playerVec.at(i).byeCnt == 0) {
                    luckyIdx = i;
                    break;
                }
            }
        }
        
        if (luckyIdx < 0) {
            luckyIdx = std::rand() % playerVec.size();
            std::cerr << "Warning: all players have been bye (odd players who got free wins)." << std::endl;
        }
        
        auto luckPlayer = playerVec.at(luckyIdx);
        
        {
            auto it = playerVec.begin();
            std::advance(it, luckyIdx);
            playerVec.erase(it);
        }
        
        
        // the odd player wins all games in the round
        MatchRecord record(luckPlayer.name, "", false);
        record.round = round;
        record.state = MatchState::completed;
        record.result.result = ResultType::win; // win
        record.pairId = std::rand();
        addMatchRecord_simple(record);
        
        auto str = "\n* Player " + luckPlayer.name + " is an odd one (no opponent to pair with) and receives a bye (a win) for round " + std::to_string(round + 1);
        matchLog(str, banksiaVerbose);
    }
    
    std::sort(playerVec.begin(), playerVec.end(), [](const TourPlayer& lhs, const TourPlayer& rhs)
              {
                  return lhs.getScore() > rhs.getScore();
              });
    
    std::set<std::string> pairedSet;
    for(auto && m : matchRecordList) {
        if (m.playernames[0].empty() || m.playernames[1].empty()) continue;
        pairedSet.insert(m.playernames[0] + "*" + m.playernames[1]);
    }
    
    if (!pairingMatchListRecusive(playerVec, round, pairedSet)) {
        std::cout << "Warning: All players have played together already." << std::endl;
        pairedSet.clear();
        if (!pairingMatchListRecusive(playerVec, round, pairedSet)) {
            std::cerr << "Error: cannot pair players." << std::endl;
            return false;
        }
    }
    
    std::string str = "\n" + std::string(tourTypeNames[static_cast<int>(type)]) + " round: " + std::to_string(round + 1);
    if (type == TourType::swiss) {
        str += "/" + std::to_string(swissRounds);
    }
    str += ", pairs: " + std::to_string(playerVec.size() / 2) + ", matches: " + std::to_string(uncompletedMatches());
    
    matchLog(str, true);
    return true;
}